

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__malloc_mad2(int a,int b,int add)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined8 local_8;
  
  iVar1 = stbi__mad2sizes_valid(in_EDI,in_ESI,in_EDX);
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = stbi__malloc(0x10b026);
  }
  return local_8;
}

Assistant:

static void *stbi__malloc_mad2(int a, int b, int add)
{
   if (!stbi__mad2sizes_valid(a, b, add)) return NULL;
   return stbi__malloc(a*b + add);
}